

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::LemmaLogger::LemmaLogger(LemmaLogger *this,string *to,Options *o)

{
  uint32 uVar1;
  undefined2 uVar2;
  bool bVar3;
  FILE *pFVar4;
  
  bVar3 = isStdOut(to);
  pFVar4 = _stdout;
  if (!bVar3) {
    pFVar4 = fopen((to->_M_dataplus)._M_p,"w");
  }
  this->str_ = (FILE *)pFVar4;
  (this->solver2asp_).ebo_.buf = (pointer)0x0;
  (this->solver2asp_).ebo_.size = 0;
  (this->solver2asp_).ebo_.cap = 0;
  (this->solver2NameIdx_).ebo_.buf = (pointer)0x0;
  (this->solver2NameIdx_).ebo_.size = 0;
  (this->solver2NameIdx_).ebo_.cap = 0;
  this->inputType_ = Asp;
  uVar1 = o->lbdMax;
  (this->options_).logMax = o->logMax;
  (this->options_).lbdMax = uVar1;
  bVar3 = o->logText;
  uVar2 = *(undefined2 *)&o->field_0xa;
  (this->options_).domOut = o->domOut;
  (this->options_).logText = bVar3;
  *(undefined2 *)&(this->options_).field_0xa = uVar2;
  this->step_ = 0;
  if (pFVar4 == (FILE *)0x0) {
    Potassco::fail(-3,"Clasp::Cli::LemmaLogger::LemmaLogger(const std::string &, const Options &)",
                   0x238,"str_","Could not open lemma log file \'%s\'!",(to->_M_dataplus)._M_p,0);
  }
  return;
}

Assistant:

LemmaLogger::LemmaLogger(const std::string& to, const Options& o)
	: str_(isStdOut(to) ? stdout : fopen(to.c_str(), "w"))
	, inputType_(Problem_t::Asp)
	, options_(o)
	, step_(0) {
	POTASSCO_EXPECT(str_, "Could not open lemma log file '%s'!", to.c_str());
}